

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_chroma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined2 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  undefined1 auVar15 [12];
  UWORD8 *pUVar16;
  WORD16 *pWVar17;
  int iVar18;
  WORD16 *pWVar19;
  int iVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  WORD16 *pWVar23;
  long lVar24;
  WORD16 *pWVar25;
  undefined1 auVar26 [16];
  undefined4 uVar27;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  int iVar39;
  int iVar40;
  undefined1 in_XMM2 [16];
  undefined1 auVar38 [16];
  int iVar41;
  undefined2 uVar49;
  undefined2 uVar50;
  undefined2 uVar51;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined2 uVar76;
  undefined2 uVar77;
  undefined2 uVar78;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  
  uVar2 = *(ulong *)pi1_coeff;
  auVar38[0] = (char)uVar2;
  cVar32 = (char)(uVar2 >> 8);
  cVar33 = (char)(uVar2 >> 0x10);
  cVar34 = (char)(uVar2 >> 0x18);
  cVar35 = (char)(uVar2 >> 0x20);
  cVar36 = (char)(uVar2 >> 0x28);
  cVar37 = (char)(uVar2 >> 0x30);
  auVar30._8_6_ = 0;
  auVar30._0_8_ = uVar2;
  auVar30[0xe] = (char)(uVar2 >> 0x38);
  auVar30[0xf] = -((long)uVar2 < 0);
  auVar29._14_2_ = auVar30._14_2_;
  auVar29._8_5_ = 0;
  auVar29._0_8_ = uVar2;
  auVar29[0xd] = -(cVar37 < '\0');
  auVar88._13_3_ = auVar29._13_3_;
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar2;
  auVar88[0xc] = cVar37;
  auVar28._12_4_ = auVar88._12_4_;
  auVar28._8_3_ = 0;
  auVar28._0_8_ = uVar2;
  auVar28[0xb] = -(cVar36 < '\0');
  auVar83._11_5_ = auVar28._11_5_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar2;
  auVar83[10] = cVar36;
  auVar67._10_6_ = auVar83._10_6_;
  auVar67[8] = 0;
  auVar67._0_8_ = uVar2;
  auVar67[9] = -(cVar35 < '\0');
  auVar61._9_7_ = auVar67._9_7_;
  auVar61[8] = cVar35;
  auVar61._0_8_ = uVar2;
  auVar15._4_8_ = auVar61._8_8_;
  auVar15[3] = -(cVar34 < '\0');
  auVar15[2] = cVar34;
  auVar15[1] = -(cVar33 < '\0');
  auVar15[0] = cVar33;
  auVar38._4_12_ = auVar15;
  auVar38[3] = -(cVar32 < '\0');
  auVar38[2] = cVar32;
  auVar38[1] = -(auVar38[0] < '\0');
  uVar27 = auVar38._0_4_;
  auVar31._4_4_ = auVar15._0_4_;
  auVar26._4_4_ = uVar27;
  auVar26._0_4_ = uVar27;
  auVar26._8_4_ = uVar27;
  auVar26._12_4_ = uVar27;
  iVar14 = dst_strd * 2;
  auVar31._0_4_ = auVar31._4_4_;
  auVar31._8_4_ = auVar31._4_4_;
  auVar31._12_4_ = auVar31._4_4_;
  if ((wd & 3U) == 0) {
    lVar22 = (long)(src_strd * 2) * 2;
    lVar24 = 0;
    auVar38 = pmovsxbd(in_XMM2,0x20202020);
    for (; lVar24 < wd * 2; lVar24 = lVar24 + 8) {
      pUVar16 = pu1_dst + lVar24;
      pauVar21 = (undefined1 (*) [16])pi2_src;
      for (iVar18 = 0; iVar18 < ht; iVar18 = iVar18 + 2) {
        auVar61 = *(undefined1 (*) [16])((long)pauVar21 + (long)src_strd * -2);
        auVar67 = *pauVar21;
        auVar83 = *(undefined1 (*) [16])(*pauVar21 + (long)src_strd * 2);
        auVar28 = *(undefined1 (*) [16])(*pauVar21 + lVar22);
        auVar82._0_12_ = auVar61._0_12_;
        auVar82._12_2_ = auVar61._6_2_;
        auVar82._14_2_ = auVar67._6_2_;
        auVar81._12_4_ = auVar82._12_4_;
        auVar81._0_10_ = auVar61._0_10_;
        auVar81._10_2_ = auVar67._4_2_;
        auVar80._10_6_ = auVar81._10_6_;
        auVar80._0_8_ = auVar61._0_8_;
        auVar80._8_2_ = auVar61._4_2_;
        auVar79._8_8_ = auVar80._8_8_;
        auVar79._6_2_ = auVar67._2_2_;
        auVar79._4_2_ = auVar61._2_2_;
        auVar79._0_2_ = auVar61._0_2_;
        auVar79._2_2_ = auVar67._0_2_;
        auVar62._2_2_ = auVar67._8_2_;
        auVar62._0_2_ = auVar61._8_2_;
        auVar62._4_2_ = auVar61._10_2_;
        auVar62._6_2_ = auVar67._10_2_;
        auVar62._8_2_ = auVar61._12_2_;
        auVar62._10_2_ = auVar67._12_2_;
        auVar62._12_2_ = auVar61._14_2_;
        auVar62._14_2_ = auVar67._14_2_;
        auVar93._0_12_ = auVar67._0_12_;
        auVar93._12_2_ = auVar67._6_2_;
        auVar93._14_2_ = auVar83._6_2_;
        auVar92._12_4_ = auVar93._12_4_;
        auVar92._0_10_ = auVar67._0_10_;
        auVar92._10_2_ = auVar83._4_2_;
        auVar91._10_6_ = auVar92._10_6_;
        auVar91._0_8_ = auVar67._0_8_;
        auVar91._8_2_ = auVar67._4_2_;
        auVar90._8_8_ = auVar91._8_8_;
        auVar90._6_2_ = auVar83._2_2_;
        auVar90._4_2_ = auVar67._2_2_;
        auVar84._0_2_ = auVar83._0_2_;
        auVar90._2_2_ = auVar84._0_2_;
        auVar90._0_2_ = auVar67._0_2_;
        auVar56._2_2_ = auVar83._8_2_;
        auVar56._0_2_ = auVar67._8_2_;
        auVar56._4_2_ = auVar67._10_2_;
        auVar56._6_2_ = auVar83._10_2_;
        auVar56._8_2_ = auVar67._12_2_;
        auVar56._10_2_ = auVar83._12_2_;
        auVar56._12_2_ = auVar67._14_2_;
        auVar56._14_2_ = auVar83._14_2_;
        auVar87._0_12_ = auVar83._0_12_;
        auVar87._12_2_ = auVar83._6_2_;
        auVar87._14_2_ = auVar28._6_2_;
        auVar86._12_4_ = auVar87._12_4_;
        auVar86._0_10_ = auVar83._0_10_;
        auVar86._10_2_ = auVar28._4_2_;
        auVar85._10_6_ = auVar86._10_6_;
        auVar85._0_8_ = auVar83._0_8_;
        auVar85._8_2_ = auVar83._4_2_;
        auVar84._8_8_ = auVar85._8_8_;
        auVar84._6_2_ = auVar28._2_2_;
        auVar84._4_2_ = auVar83._2_2_;
        auVar84._2_2_ = auVar28._0_2_;
        auVar69._2_2_ = auVar28._8_2_;
        auVar69._0_2_ = auVar83._8_2_;
        auVar69._4_2_ = auVar83._10_2_;
        auVar69._6_2_ = auVar28._10_2_;
        auVar69._8_2_ = auVar83._12_2_;
        auVar69._10_2_ = auVar28._12_2_;
        auVar69._12_2_ = auVar83._14_2_;
        auVar69._14_2_ = auVar28._14_2_;
        auVar83 = pmaddwd(auVar79,auVar26);
        auVar61 = pmaddwd(auVar62,auVar26);
        auVar88 = pmaddwd(auVar84,auVar31);
        auVar67 = pmaddwd(auVar69,auVar31);
        iVar20 = auVar38._0_4_;
        iVar39 = auVar38._4_4_;
        iVar40 = auVar38._8_4_;
        iVar41 = auVar38._12_4_;
        auVar89._0_4_ = (auVar88._0_4_ + auVar83._0_4_ >> 6) + iVar20 >> 6;
        auVar89._4_4_ = (auVar88._4_4_ + auVar83._4_4_ >> 6) + iVar39 >> 6;
        auVar89._8_4_ = (auVar88._8_4_ + auVar83._8_4_ >> 6) + iVar40 >> 6;
        auVar89._12_4_ = (auVar88._12_4_ + auVar83._12_4_ >> 6) + iVar41 >> 6;
        auVar83 = packssdw(auVar89,auVar89);
        auVar70._0_4_ = (auVar67._0_4_ + auVar61._0_4_ >> 6) + iVar20 >> 6;
        auVar70._4_4_ = (auVar67._4_4_ + auVar61._4_4_ >> 6) + iVar39 >> 6;
        auVar70._8_4_ = (auVar67._8_4_ + auVar61._8_4_ >> 6) + iVar40 >> 6;
        auVar70._12_4_ = (auVar67._12_4_ + auVar61._12_4_ >> 6) + iVar41 >> 6;
        auVar61 = packssdw(auVar70,auVar70);
        sVar6 = auVar83._0_2_;
        sVar7 = auVar83._2_2_;
        sVar8 = auVar83._4_2_;
        sVar9 = auVar83._6_2_;
        sVar10 = auVar61._0_2_;
        sVar11 = auVar61._2_2_;
        sVar12 = auVar61._4_2_;
        sVar13 = auVar61._6_2_;
        *(ulong *)pUVar16 =
             CONCAT44(CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar61[6] - (0xff < sVar13),
                               CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar61[4] -
                                        (0xff < sVar12),
                                        CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar61[2] -
                                                 (0xff < sVar11),
                                                 (0 < sVar10) * (sVar10 < 0x100) * auVar61[0] -
                                                 (0xff < sVar10)))),
                      CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar83[6] - (0xff < sVar9),
                               CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar83[4] - (0xff < sVar8),
                                        CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar83[2] -
                                                 (0xff < sVar7),
                                                 (0 < sVar6) * (sVar6 < 0x100) * auVar83[0] -
                                                 (0xff < sVar6)))));
        puVar1 = (undefined2 *)(*pauVar21 + (long)(src_strd * 3) * 2);
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar22);
        auVar88 = pmaddwd(auVar90,auVar26);
        auVar67 = pmaddwd(auVar56,auVar26);
        auVar74._0_12_ = auVar28._0_12_;
        auVar74._12_2_ = auVar28._6_2_;
        auVar74._14_2_ = puVar1[3];
        auVar73._12_4_ = auVar74._12_4_;
        auVar73._0_10_ = auVar28._0_10_;
        auVar73._10_2_ = puVar1[2];
        auVar72._10_6_ = auVar73._10_6_;
        auVar72._0_8_ = auVar28._0_8_;
        auVar72._8_2_ = auVar28._4_2_;
        auVar71._8_8_ = auVar72._8_8_;
        auVar71._6_2_ = puVar1[1];
        auVar71._4_2_ = auVar28._2_2_;
        auVar71._2_2_ = *puVar1;
        auVar71._0_2_ = auVar28._0_2_;
        auVar47._2_2_ = puVar1[4];
        auVar47._0_2_ = auVar28._8_2_;
        auVar47._4_2_ = auVar28._10_2_;
        auVar47._6_2_ = puVar1[5];
        auVar47._8_2_ = auVar28._12_2_;
        auVar47._10_2_ = puVar1[6];
        auVar47._12_2_ = auVar28._14_2_;
        auVar47._14_2_ = puVar1[7];
        auVar83 = pmaddwd(auVar71,auVar31);
        auVar61 = pmaddwd(auVar47,auVar31);
        auVar75._0_4_ = (auVar83._0_4_ + auVar88._0_4_ >> 6) + iVar20 >> 6;
        auVar75._4_4_ = (auVar83._4_4_ + auVar88._4_4_ >> 6) + iVar39 >> 6;
        auVar75._8_4_ = (auVar83._8_4_ + auVar88._8_4_ >> 6) + iVar40 >> 6;
        auVar75._12_4_ = (auVar83._12_4_ + auVar88._12_4_ >> 6) + iVar41 >> 6;
        auVar83 = packssdw(auVar75,auVar75);
        auVar48._0_4_ = (auVar61._0_4_ + auVar67._0_4_ >> 6) + iVar20 >> 6;
        auVar48._4_4_ = (auVar61._4_4_ + auVar67._4_4_ >> 6) + iVar39 >> 6;
        auVar48._8_4_ = (auVar61._8_4_ + auVar67._8_4_ >> 6) + iVar40 >> 6;
        auVar48._12_4_ = (auVar61._12_4_ + auVar67._12_4_ >> 6) + iVar41 >> 6;
        auVar61 = packssdw(auVar48,auVar48);
        sVar6 = auVar83._0_2_;
        sVar7 = auVar83._2_2_;
        sVar8 = auVar83._4_2_;
        sVar9 = auVar83._6_2_;
        sVar10 = auVar61._0_2_;
        sVar11 = auVar61._2_2_;
        sVar12 = auVar61._4_2_;
        sVar13 = auVar61._6_2_;
        *(ulong *)(pUVar16 + dst_strd) =
             CONCAT44(CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar61[6] - (0xff < sVar13),
                               CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar61[4] -
                                        (0xff < sVar12),
                                        CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar61[2] -
                                                 (0xff < sVar11),
                                                 (0 < sVar10) * (sVar10 < 0x100) * auVar61[0] -
                                                 (0xff < sVar10)))),
                      CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar83[6] - (0xff < sVar9),
                               CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar83[4] - (0xff < sVar8),
                                        CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar83[2] -
                                                 (0xff < sVar7),
                                                 (0 < sVar6) * (sVar6 < 0x100) * auVar83[0] -
                                                 (0xff < sVar6)))));
        pUVar16 = pUVar16 + iVar14;
      }
      pi2_src = (WORD16 *)((long)pi2_src + 0x10);
    }
  }
  else {
    iVar18 = src_strd * 2;
    pUVar16 = pu1_dst + dst_strd;
    pWVar19 = pi2_src + src_strd * 3;
    pWVar17 = pi2_src + iVar18;
    pWVar23 = pi2_src + src_strd;
    pWVar25 = pi2_src + -(long)src_strd;
    iVar20 = 0;
    auVar38 = pmovsxbd(in_XMM2,0x20202020);
    for (; iVar20 < ht; iVar20 = iVar20 + 2) {
      for (lVar22 = 0; (int)lVar22 < wd * 2; lVar22 = lVar22 + 4) {
        uVar2 = *(ulong *)(pWVar25 + lVar22);
        uVar3 = *(ulong *)(pi2_src + lVar22);
        uVar51 = (undefined2)(uVar3 >> 0x30);
        auVar60._8_4_ = 0;
        auVar60._0_8_ = uVar2;
        auVar60._12_2_ = (short)(uVar2 >> 0x30);
        auVar60._14_2_ = uVar51;
        uVar50 = (undefined2)(uVar3 >> 0x20);
        auVar59._12_4_ = auVar60._12_4_;
        auVar59._8_2_ = 0;
        auVar59._0_8_ = uVar2;
        auVar59._10_2_ = uVar50;
        auVar58._10_6_ = auVar59._10_6_;
        auVar58._8_2_ = (short)(uVar2 >> 0x20);
        auVar58._0_8_ = uVar2;
        uVar49 = (undefined2)(uVar3 >> 0x10);
        auVar57._8_8_ = auVar58._8_8_;
        auVar57._6_2_ = uVar49;
        auVar57._4_2_ = (short)(uVar2 >> 0x10);
        auVar52._0_2_ = (undefined2)uVar3;
        auVar57._0_2_ = (undefined2)uVar2;
        auVar57._2_2_ = auVar52._0_2_;
        auVar61 = pmaddwd(auVar57,auVar26);
        uVar2 = *(ulong *)(pWVar23 + lVar22);
        uVar4 = *(ulong *)(pWVar17 + lVar22);
        uVar78 = (undefined2)(uVar2 >> 0x30);
        auVar55._8_4_ = 0;
        auVar55._0_8_ = uVar3;
        auVar55._12_2_ = uVar51;
        auVar55._14_2_ = uVar78;
        auVar54._12_4_ = auVar55._12_4_;
        auVar54._8_2_ = 0;
        auVar54._0_8_ = uVar3;
        uVar77 = (undefined2)(uVar2 >> 0x20);
        auVar54._10_2_ = uVar77;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._8_2_ = uVar50;
        auVar53._0_8_ = uVar3;
        auVar52._8_8_ = auVar53._8_8_;
        uVar76 = (undefined2)(uVar2 >> 0x10);
        auVar52._6_2_ = uVar76;
        auVar52._4_2_ = uVar49;
        auVar63._0_2_ = (undefined2)uVar2;
        auVar52._2_2_ = auVar63._0_2_;
        uVar51 = (undefined2)(uVar4 >> 0x30);
        auVar66._8_4_ = 0;
        auVar66._0_8_ = uVar2;
        auVar66._12_2_ = uVar78;
        auVar66._14_2_ = uVar51;
        uVar50 = (undefined2)(uVar4 >> 0x20);
        auVar65._12_4_ = auVar66._12_4_;
        auVar65._8_2_ = 0;
        auVar65._0_8_ = uVar2;
        auVar65._10_2_ = uVar50;
        auVar64._10_6_ = auVar65._10_6_;
        auVar64._8_2_ = uVar77;
        auVar64._0_8_ = uVar2;
        uVar49 = (undefined2)(uVar4 >> 0x10);
        auVar63._8_8_ = auVar64._8_8_;
        auVar63._6_2_ = uVar49;
        auVar63._4_2_ = uVar76;
        auVar42._0_2_ = (undefined2)uVar4;
        auVar63._2_2_ = auVar42._0_2_;
        auVar67 = pmaddwd(auVar63,auVar31);
        auVar68._0_4_ = (auVar67._0_4_ + auVar61._0_4_ >> 6) + auVar38._0_4_ >> 6;
        auVar68._4_4_ = (auVar67._4_4_ + auVar61._4_4_ >> 6) + auVar38._4_4_ >> 6;
        auVar68._8_4_ = (auVar67._8_4_ + auVar61._8_4_ >> 6) + auVar38._8_4_ >> 6;
        auVar68._12_4_ = (auVar67._12_4_ + auVar61._12_4_ >> 6) + auVar38._12_4_ >> 6;
        auVar61 = packssdw(auVar68,auVar68);
        sVar6 = auVar61._0_2_;
        sVar7 = auVar61._2_2_;
        sVar8 = auVar61._4_2_;
        sVar9 = auVar61._6_2_;
        *(ulong *)(pu1_dst + lVar22) =
             (ulong)CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar61[6] - (0xff < sVar9),
                             CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar61[4] - (0xff < sVar8),
                                      CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar61[2] -
                                               (0xff < sVar7),
                                               (0 < sVar6) * (sVar6 < 0x100) * auVar61[0] -
                                               (0xff < sVar6)))) |
             *(ulong *)(pu1_dst + lVar22) & 0xffffffff00000000;
        uVar5 = *(undefined8 *)(pWVar19 + lVar22);
        auVar67 = pmaddwd(auVar52,auVar26);
        auVar45._8_4_ = 0;
        auVar45._0_8_ = uVar4;
        auVar45._12_2_ = uVar51;
        auVar45._14_2_ = (short)((ulong)uVar5 >> 0x30);
        auVar44._12_4_ = auVar45._12_4_;
        auVar44._8_2_ = 0;
        auVar44._0_8_ = uVar4;
        auVar44._10_2_ = (short)((ulong)uVar5 >> 0x20);
        auVar43._10_6_ = auVar44._10_6_;
        auVar43._8_2_ = uVar50;
        auVar43._0_8_ = uVar4;
        auVar42._8_8_ = auVar43._8_8_;
        auVar42._6_2_ = (short)((ulong)uVar5 >> 0x10);
        auVar42._4_2_ = uVar49;
        auVar42._2_2_ = (short)uVar5;
        auVar61 = pmaddwd(auVar42,auVar31);
        auVar46._0_4_ = (auVar61._0_4_ + auVar67._0_4_ >> 6) + auVar38._0_4_ >> 6;
        auVar46._4_4_ = (auVar61._4_4_ + auVar67._4_4_ >> 6) + auVar38._4_4_ >> 6;
        auVar46._8_4_ = (auVar61._8_4_ + auVar67._8_4_ >> 6) + auVar38._8_4_ >> 6;
        auVar46._12_4_ = (auVar61._12_4_ + auVar67._12_4_ >> 6) + auVar38._12_4_ >> 6;
        auVar61 = packssdw(auVar46,auVar46);
        sVar6 = auVar61._0_2_;
        sVar7 = auVar61._2_2_;
        sVar8 = auVar61._4_2_;
        sVar9 = auVar61._6_2_;
        *(ulong *)(pUVar16 + lVar22) =
             (ulong)CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar61[6] - (0xff < sVar9),
                             CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar61[4] - (0xff < sVar8),
                                      CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar61[2] -
                                               (0xff < sVar7),
                                               (0 < sVar6) * (sVar6 < 0x100) * auVar61[0] -
                                               (0xff < sVar6)))) |
             *(ulong *)(pUVar16 + lVar22) & 0xffffffff00000000;
      }
      pu1_dst = pu1_dst + iVar14;
      pUVar16 = pUVar16 + iVar14;
      pi2_src = pi2_src + iVar18;
      pWVar19 = pWVar19 + iVar18;
      pWVar17 = pWVar17 + iVar18;
      pWVar23 = pWVar23 + iVar18;
      pWVar25 = pWVar25 + iVar18;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                               UWORD8 *pu1_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b;
    __m128i s4_8x16b, s5_8x16b, s6_8x16b, s7_8x16b, s8_8x16b, s9_8x16b;
    __m128i s11_8x16b, s12_8x16b, s15_8x16b, s16_8x16b;
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;
    __m128i s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b;
    __m128i s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b;


/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

/*  seting  values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);

/*  outer for loop starts from here */
    if(wd % 4 == 0)
    { /* wd = multiple of 8 case */

        pi2_src_copy = pi2_src;
        pu1_dst_copy = pu1_dst;

        for(col = 0; col < 2 * wd; col += 8)
        {

            pi2_src = pi2_src_copy + col;
            pu1_dst = pu1_dst_copy + col;


            for(row = 0; row < ht; row += 2)
            {

                /*load 16 pixel values */
                s21_8x16b  = _mm_load_si128((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 16 pixel values */
                s22_8x16b = _mm_load_si128((__m128i *)(pi2_src + (0 * src_strd)));


                /*load 16 pixel values */
                s23_8x16b = _mm_load_si128((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 16 pixel values */
                s24_8x16b = _mm_load_si128((__m128i *)(pi2_src + (2 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s21_8x16b, s22_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s23_8x16b, s24_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b);

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s7_8x16b);


                s25_8x16b = _mm_load_si128((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s22_8x16b, s23_8x16b);

                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s24_8x16b, s25_8x16b);

                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s7_8x16b);

                pi2_src += 2 * src_strd;
                pu1_dst += 2 * dst_strd;


            } /* inner for loop ends here(8-output values in single iteration) */

        }
    }
    else
    { /* wd = multiple of 4 case */

        for(row = 0; row < ht; row += 2)
        {
            pi2_src_copy = pi2_src;
            pu1_dst_copy = pu1_dst;
            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 8 pixel values  */
                s21_8x16b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 8 pixel values */
                s22_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                /*load 8 pixel values */
                s23_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 8 pixel values */
                s24_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */


                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

                s25_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);
                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);
                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s9_8x16b);

                pi2_src += 4;   /* To pointer update */
                pu1_dst += 4;
            } /* inner for loop ends here(8-output values in single iteration) */

            pi2_src = pi2_src_copy + 2 * src_strd; /* pointer update */
            pu1_dst = pu1_dst_copy + 2 * dst_strd; /* pointer update */
        }
    }

}